

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_encoder.h
# Opt level: O2

void __thiscall
draco::MeshEdgebreakerTraversalValenceEncoder::Done(MeshEdgebreakerTraversalValenceEncoder *this)

{
  EncoderBuffer *out_buffer;
  pointer pvVar1;
  uint32_t *symbols;
  ulong uVar2;
  int i;
  ulong uVar3;
  long lVar4;
  
  MeshEdgebreakerTraversalEncoder::EncodeStartFaces(&this->super_MeshEdgebreakerTraversalEncoder);
  MeshEdgebreakerTraversalEncoder::EncodeAttributeSeams
            (&this->super_MeshEdgebreakerTraversalEncoder);
  out_buffer = &(this->super_MeshEdgebreakerTraversalEncoder).traversal_buffer_;
  lVar4 = 8;
  for (uVar3 = 0;
      pvVar1 = (this->context_symbols_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->context_symbols_).
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
      uVar3 = uVar3 + 1) {
    EncodeVarint<unsigned_int>
              ((uint)((ulong)(*(long *)((long)&(pvVar1->
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               )._M_impl.super__Vector_impl_data + lVar4) -
                             *(long *)((long)pvVar1 + lVar4 + -8)) >> 2),out_buffer);
    pvVar1 = (this->context_symbols_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    symbols = *(uint32_t **)((long)pvVar1 + lVar4 + -8);
    uVar2 = *(long *)((long)&(pvVar1->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data + lVar4) - (long)symbols;
    if (uVar2 != 0) {
      EncodeSymbols(symbols,(int)(uVar2 >> 2),1,(Options *)0x0,out_buffer);
    }
    lVar4 = lVar4 + 0x18;
  }
  return;
}

Assistant:

void Done() {
    // Store the init face configurations and attribute seam data
    MeshEdgebreakerTraversalEncoder::EncodeStartFaces();
    MeshEdgebreakerTraversalEncoder::EncodeAttributeSeams();

    // Store the contexts.
    for (int i = 0; i < context_symbols_.size(); ++i) {
      EncodeVarint<uint32_t>(static_cast<uint32_t>(context_symbols_[i].size()),
                             GetOutputBuffer());
      if (context_symbols_[i].size() > 0) {
        EncodeSymbols(context_symbols_[i].data(),
                      static_cast<int>(context_symbols_[i].size()), 1, nullptr,
                      GetOutputBuffer());
      }
    }
  }